

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O2

QString * commandLinesForOutput(QString *__return_storage_ptr__,QStringList *commands)

{
  QString *pQVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  ulong i;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (commandLinesForOutput(QList<QString>)::errchk == '\0') {
    iVar3 = __cxa_guard_acquire(&commandLinesForOutput(QList<QString>)::errchk);
    if (iVar3 != 0) {
      commandLinesForOutput::errchk.d.d = (Data *)0x0;
      local_50.d = (Data *)0x0;
      local_50.ptr = (char16_t *)0x0;
      commandLinesForOutput::errchk.d.ptr = L"if errorlevel 1 goto VCEnd";
      local_50.size = 0;
      commandLinesForOutput::errchk.d.size = 0x1a;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      __cxa_atexit(QString::~QString,&commandLinesForOutput::errchk,&__dso_handle);
      __cxa_guard_release(&commandLinesForOutput(QList<QString>)::errchk);
    }
  }
  iVar3 = (int)(commands->d).size;
  i = (ulong)(iVar3 - 1);
  for (uVar4 = iVar3 - 2; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
    pQVar1 = (commands->d).ptr;
    QString::QString((QString *)&local_50,"rem");
    cVar2 = QString::startsWith((QString *)(pQVar1 + uVar4),(CaseSensitivity)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    if (cVar2 == '\0') {
      QList<QString>::emplace<QString_const&>(commands,i,&commandLinesForOutput::errchk);
    }
    i = i - 1;
  }
  QString::QString((QString *)&local_50,"\r\n");
  QListSpecialMethods<QString>::join
            (__return_storage_ptr__,(QListSpecialMethods<QString> *)commands,(QString *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString commandLinesForOutput(QStringList commands)
{
    // MSBuild puts the contents of the custom commands into a batch file and calls it.
    // As we want every sub-command to be error-checked (as is done by makefile-based
    // backends), we insert the checks ourselves, using the undocumented jump target.
    static QString errchk = QStringLiteral("if errorlevel 1 goto VCEnd");
    for (int i = commands.size() - 2; i >= 0; --i) {
        if (!commands.at(i).startsWith("rem", Qt::CaseInsensitive))
            commands.insert(i + 1, errchk);
    }
    return commands.join("\r\n");
}